

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lines.c
# Opt level: O0

void plonk(int x,int y,_Bool blend)

{
  int iVar1;
  int iVar2;
  byte in_DL;
  int in_ESI;
  int in_EDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  
  al_set_target_bitmap(dbuf);
  fade();
  al_set_blender(0,2);
  draw_clip_rect();
  red_dot(unaff_retaddr_00,unaff_retaddr);
  if ((last_x != -1) || (iVar1 = in_EDI, iVar2 = in_ESI, last_y != -1)) {
    my_set_clip_rect();
    if ((in_DL & 1) != 0) {
      al_set_blender(0,2,3);
    }
    al_draw_line((float)last_x,(float)last_y,(float)in_EDI,(float)in_ESI,white._0_8_,white._8_8_,0);
    last_y = -1;
    last_x = -1;
    reset_clip_rect();
    iVar1 = last_x;
    iVar2 = last_y;
  }
  last_y = iVar2;
  last_x = iVar1;
  flip();
  return;
}

Assistant:

static void plonk(const int x, const int y, bool blend)
{
   al_set_target_bitmap(dbuf);

   fade();
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_ZERO);
   draw_clip_rect();
   red_dot(x, y);

   if (last_x == -1 && last_y == -1) {
      last_x = x;
      last_y = y;
   }
   else {
      my_set_clip_rect();
      if (blend) {
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
      }
      al_draw_line(last_x, last_y, x, y, white, 0);
      last_x = last_y = -1;
      reset_clip_rect();
   }

   flip();
}